

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  int iVar1;
  uint uVar2;
  xmlBufPtr buf_00;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  
  if (len < 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    if ((in != (xmlParserInputBufferPtr)0x0) && (in->error == 0)) {
      if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar1 = xmlBufAdd(in->buffer,(xmlChar *)buf,len);
        uVar5 = -(uint)(iVar1 != 0) | len;
      }
      else {
        buf_00 = in->raw;
        if (buf_00 == (xmlBufPtr)0x0) {
          buf_00 = xmlBufCreate();
          in->raw = buf_00;
        }
        iVar1 = xmlBufAdd(buf_00,(xmlChar *)buf,len);
        if (iVar1 == 0) {
          sVar3 = xmlBufUse(in->raw);
          uVar2 = xmlCharEncInput(in,1);
          if ((int)uVar2 < 0) {
            xmlIOErr(0x608,(char *)0x0);
            in->error = 0x608;
          }
          else {
            sVar4 = xmlBufUse(in->raw);
            in->rawconsumed = in->rawconsumed + ((sVar3 & 0xffffffff) - sVar4);
            uVar5 = uVar2;
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    int nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        unsigned int use;

        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate();
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0)
	    return(-1);

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
	use = xmlBufUse(in->raw);
	nbchars = xmlCharEncInput(in, 1);
	if (nbchars < 0) {
	    xmlIOErr(XML_IO_ENCODER, NULL);
	    in->error = XML_IO_ENCODER;
	    return(-1);
	}
	in->rawconsumed += (use - xmlBufUse(in->raw));
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0)
	    return(-1);
    }
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: pushed %d chars, buffer %d/%d\n",
            nbchars, xmlBufUse(in->buffer), xmlBufLength(in->buffer));
#endif
    return(nbchars);
}